

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpChildrenAscii(Node *this,ostream *s,int indent)

{
  bool bVar1;
  pointer pNVar2;
  size_t i;
  ulong uVar3;
  pointer pNVar4;
  long lVar5;
  
  pNVar4 = (this->children).
           super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  pNVar2 = (this->children).
           super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pNVar2 != pNVar4) || (this->force_has_children == true)) {
    lVar5 = 0;
    for (uVar3 = 0; uVar3 < (ulong)(((long)pNVar2 - (long)pNVar4) / 0x70); uVar3 = uVar3 + 1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pNVar4->name)._M_dataplus._M_p + lVar5),"EncryptionType");
      if (!bVar1) {
        DumpAscii((Node *)((long)&(((this->children).
                                    super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                  _M_p + lVar5),s,indent);
      }
      pNVar4 = (this->children).
               super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      pNVar2 = (this->children).
               super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 0x70;
    }
  }
  return;
}

Assistant:

void FBX::Node::DumpChildrenAscii(std::ostream& s, int indent)
{
    // children will need a lot of padding and corralling
    if (children.size() || force_has_children) {
        for (size_t i = 0; i < children.size(); ++i) {
            // no compression in ascii files, so skip this node if it exists
            if (children[i].name == "EncryptionType") { continue; }
            // the child can dump itself
            children[i].DumpAscii(s, indent);
        }
    }
}